

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxColorLiteral::Emit(FxColorLiteral *this,VMFunctionBuilder *build)

{
  long *plVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ExpEmit EVar6;
  long lVar7;
  long lVar8;
  ExpEmit in;
  
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  uVar3 = uVar3 & 0xffff;
  uVar4 = VMFunctionBuilder::GetConstantInt(build,this->constval);
  VMFunctionBuilder::Emit(build,2,uVar3,(VM_SHALF)uVar4);
  lVar7 = 0x18;
  lVar8 = 0;
  do {
    if (lVar7 == -8) {
      EVar6._0_4_ = uVar3 | 0x1000000;
      EVar6.Konst = false;
      EVar6.Fixed = false;
      EVar6.Final = false;
      EVar6.Target = false;
      return EVar6;
    }
    plVar1 = *(long **)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                       lVar8);
    if (plVar1 != (long *)0x0) {
      cVar2 = (**(code **)(*plVar1 + 0x18))();
      if (cVar2 != '\0') {
        __assert_fail("!ArgList[i]->isConstant()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x20f8,"virtual ExpEmit FxColorLiteral::Emit(VMFunctionBuilder *)");
      }
      plVar1 = *(long **)((long)(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array +
                         lVar8);
      EVar6 = (ExpEmit)(**(code **)(*plVar1 + 0x48))(plVar1,build);
      in = EVar6;
      ExpEmit::Free(&in,build);
      uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      uVar4 = uVar4 & 0xffff;
      uVar5 = VMFunctionBuilder::GetConstantInt(build,0);
      VMFunctionBuilder::Emit(build,0x80,uVar4,EVar6._0_4_ & 0xffff,uVar5);
      uVar5 = VMFunctionBuilder::GetConstantInt(build,0xff);
      VMFunctionBuilder::Emit(build,0x7e,uVar4,uVar4,uVar5);
      if (lVar7 != 0) {
        VMFunctionBuilder::Emit(build,0x5b,uVar4,uVar4,(int)lVar7);
      }
      VMFunctionBuilder::Emit(build,0x79,uVar3,uVar3,uVar4);
    }
    lVar7 = lVar7 + -8;
    lVar8 = lVar8 + 8;
  } while( true );
}

Assistant:

ExpEmit FxColorLiteral::Emit(VMFunctionBuilder *build)
{
	ExpEmit out(build, REGT_INT);
	build->Emit(OP_LK, out.RegNum, build->GetConstantInt(constval));
	for (int i = 0; i < 4; i++)
	{
		if (ArgList[i] != nullptr)
		{
			assert(!ArgList[i]->isConstant());
			ExpEmit in = ArgList[i]->Emit(build);
			in.Free(build);
			ExpEmit work(build, REGT_INT);
			build->Emit(OP_MAX_RK, work.RegNum, in.RegNum, build->GetConstantInt(0));
			build->Emit(OP_MIN_RK, work.RegNum, work.RegNum, build->GetConstantInt(255));
			if (i != 3) build->Emit(OP_SLL_RI, work.RegNum, work.RegNum, 24 - (i * 8));
			build->Emit(OP_OR_RR, out.RegNum, out.RegNum, work.RegNum);
		}
	}
	return out;
}